

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CMU462::Collada::writeCurrentTime(ofstream *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  tm *ptVar6;
  ostream *poVar7;
  time_t t;
  time_t local_38;
  
  local_38 = time((time_t *)0x0);
  ptVar6 = localtime(&local_38);
  iVar1 = ptVar6->tm_sec;
  iVar2 = ptVar6->tm_min;
  iVar3 = ptVar6->tm_hour;
  iVar4 = ptVar6->tm_mday;
  iVar5 = ptVar6->tm_mon;
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)out,ptVar6->tm_year + 0x76c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-",1);
  if (iVar5 < 10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"0",1);
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)out,iVar5 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-",1);
  if (iVar4 < 10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"0",1);
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)out,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"T",1);
  if (iVar3 < 10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"0",1);
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)out,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
  if (iVar2 < 10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"0",1);
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)out,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
  if (iVar1 < 10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"0",1);
  }
  std::ostream::operator<<((ostream *)out,iVar1);
  return;
}

Assistant:

void writeCurrentTime( ofstream& out )
{
   auto t = time(nullptr);
   auto tm = *localtime(&t);

   out << tm.tm_year+1900 << "-";
   if( tm.tm_mon < 10 ) out << "0";
   out << tm.tm_mon+1 << "-";
   if( tm.tm_mday < 10 ) out << "0";
   out << tm.tm_mday << "T";
   if( tm.tm_hour < 10 ) out << "0";
   out << tm.tm_hour << ":";
   if( tm.tm_min < 10 ) out << "0";
   out << tm.tm_min << ":";
   if( tm.tm_sec < 10 ) out << "0";
   out << tm.tm_sec;
}